

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O3

bool slang::ast::anon_unknown_0::PortConnectionBuilder::areDimSizesEqual
               (span<const_slang::ConstantRange,_18446744073709551615UL> left,
               span<const_slang::ConstantRange,_18446744073709551615UL> right)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  __extent_storage<18446744073709551615UL> _Var6;
  int iVar7;
  bool bVar8;
  
  _Var6 = left._M_extent._M_extent_value;
  if (_Var6._M_extent_value != right._M_extent._M_extent_value._M_extent_value) {
    return false;
  }
  if (_Var6._M_extent_value != 0) {
    lVar5 = 0;
    do {
      iVar7 = right._M_ptr[lVar5].left;
      iVar1 = right._M_ptr[lVar5].right;
      iVar2 = left._M_ptr[lVar5].left;
      iVar3 = left._M_ptr[lVar5].right;
      iVar4 = iVar7 - iVar1;
      if (iVar7 - iVar1 == 0 || iVar7 < iVar1) {
        iVar4 = -(iVar7 - iVar1);
      }
      iVar7 = iVar2 - iVar3;
      if (iVar2 - iVar3 == 0 || iVar2 < iVar3) {
        iVar7 = -(iVar2 - iVar3);
      }
    } while ((iVar7 == iVar4) &&
            (bVar8 = _Var6._M_extent_value - 1 != lVar5, lVar5 = lVar5 + 1, bVar8));
    return iVar7 == iVar4;
  }
  return true;
}

Assistant:

static bool areDimSizesEqual(std::span<const ConstantRange> left,
                                 std::span<const ConstantRange> right) {
        if (left.size() != right.size())
            return false;

        for (size_t i = 0; i < left.size(); i++) {
            if (left[i].width() != right[i].width())
                return false;
        }

        return true;
    }